

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

void __thiscall curlpp::FormParts::File::add(File *this,curl_httppost **first,curl_httppost **last)

{
  if ((this->mContentType)._M_string_length != 0) {
    curl_formadd(first,last,2,(this->super_FormPart).mName._M_dataplus._M_p,10,
                 (this->mFilename)._M_dataplus._M_p,0xe,(this->mContentType)._M_dataplus._M_p,0x11);
    return;
  }
  curl_formadd(first,last,2,(this->super_FormPart).mName._M_dataplus._M_p,10,
               (this->mFilename)._M_dataplus._M_p,0x11);
  return;
}

Assistant:

void
curlpp::FormParts::File::add(::curl_httppost ** first, 
			     ::curl_httppost ** last)
{
  // One instance = One curl_httppost, so we don't
  // need to duplicate the memory.
  if(mContentType.empty()) {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME,
		 mName.c_str(), 
		 CURLFORM_FILE,
		 mFilename.c_str(),
		 CURLFORM_END );
  }
  else {
    curl_formadd(first, 
		 last, 
		 CURLFORM_PTRNAME, 
		 mName.c_str(), 
		 CURLFORM_FILE,
		 mFilename.c_str(),
		 CURLFORM_CONTENTTYPE,
		 mContentType.c_str(),
		 CURLFORM_END);
  }
}